

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O3

REF_STATUS
ref_shard_add_pri_as_tet(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes,REF_BOOL check_volume)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  undefined8 uVar10;
  double dVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  REF_DBL vol_1;
  REF_INT pri_nodes [27];
  REF_INT tet_nodes [27];
  REF_GLOB pri_global [27];
  REF_GLOB global [27];
  double local_2f0;
  long local_2e8;
  undefined8 local_2e0;
  uint local_2d8 [28];
  uint local_268;
  uint local_264;
  uint local_260;
  uint local_25c;
  REF_CELL local_1f0;
  double local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1c8;
  long local_1c0;
  long local_108 [27];
  
  lVar9 = 0;
  do {
    iVar1 = nodes[lVar9];
    lVar12 = -1;
    if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
       (lVar12 = ref_node->global[iVar1], lVar12 < 0)) {
      lVar12 = -1;
    }
    local_108[lVar9] = lVar12;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  if (local_108[1] <= local_108[0]) {
    local_108[0] = local_108[1];
  }
  lVar9 = local_108[3];
  if (local_108[2] < local_108[3]) {
    lVar9 = local_108[2];
  }
  if (local_108[0] < lVar9) {
    lVar9 = local_108[0];
  }
  local_2e8 = local_108[5];
  if (local_108[4] < local_108[5]) {
    local_2e8 = local_108[4];
  }
  if (lVar9 <= local_2e8) {
    local_2e8 = lVar9;
  }
  uVar2 = *nodes;
  uVar3 = nodes[1];
  uVar4 = nodes[2];
  uVar5 = nodes[3];
  uVar8 = nodes[4];
  uVar6 = nodes[5];
  local_2d8[1] = uVar3;
  local_2d8[5] = uVar6;
  local_2d8[4] = uVar8;
  local_2d8[0] = uVar2;
  local_2d8[3] = uVar5;
  local_2d8[2] = uVar4;
  if (local_108[1] == local_2e8) {
    local_2d8[1] = uVar4;
    local_2d8[5] = uVar5;
    local_2d8[4] = uVar6;
    local_2d8[0] = uVar3;
    local_2d8[3] = uVar8;
    local_2d8[2] = uVar2;
  }
  if (local_108[2] == local_2e8) {
    local_2d8[0] = uVar4;
    local_2d8[1] = uVar2;
    local_2d8[2] = uVar3;
    local_2d8[3] = uVar6;
    local_2d8[4] = uVar5;
    local_2d8[5] = uVar8;
  }
  if (local_108[3] == local_2e8) {
    local_2d8[0] = uVar5;
    local_2d8[1] = uVar6;
    local_2d8[2] = uVar8;
    local_2d8[3] = uVar2;
    local_2d8[4] = uVar4;
    local_2d8[5] = uVar3;
  }
  if (local_108[4] == local_2e8) {
    local_2d8[0] = uVar8;
    local_2d8[1] = uVar5;
    local_2d8[2] = uVar6;
    local_2d8[3] = uVar3;
    local_2d8[4] = uVar2;
    local_2d8[5] = uVar4;
  }
  if (local_108[5] == local_2e8) {
    local_2d8[0] = uVar6;
    local_2d8[1] = uVar8;
    local_2d8[2] = uVar5;
    local_2d8[3] = uVar4;
    local_2d8[4] = uVar3;
    local_2d8[5] = uVar2;
  }
  uVar5 = local_2d8[5];
  uVar4 = local_2d8[4];
  uVar3 = local_2d8[2];
  uVar2 = local_2d8[1];
  local_2e0 = CONCAT44((int)((ulong)local_108[5] >> 0x20),local_2d8[0]);
  uVar14 = (ulong)local_2d8[3];
  local_268 = local_2d8[0];
  local_264 = local_2d8[4];
  local_260 = local_2d8[5];
  local_25c = local_2d8[3];
  local_1f0 = ref_cell;
  uVar8 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_268);
  uVar7 = local_2e0;
  if (uVar8 == 0) {
    uVar6 = (uint)local_2e0;
    if (check_volume != 0) {
      uVar8 = ref_node_tet_vol(ref_node,(REF_INT *)&local_268,&local_1e8);
      if (uVar8 != 0) {
        pcVar13 = "tet vol";
        uVar10 = 0x226;
        goto LAB_00188108;
      }
      if (local_1e8 <= 0.0) {
        printf("tet vol %e\n");
        printf("minnode %ld\n",local_2e8);
        printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
        printf("prism %d %d %d %d %d %d\n",uVar7 & 0xffffffff,uVar2,(ulong)uVar3,uVar14,uVar4,uVar5)
        ;
        printf("tet %d %d %d %d\n",(ulong)local_268,(ulong)local_264,(ulong)local_260,
               (ulong)local_25c);
      }
    }
    lVar9 = 0;
    do {
      uVar8 = local_2d8[lVar9];
      dVar11 = -NAN;
      if (((-1 < (long)(int)uVar8) && ((int)uVar8 < ref_node->max)) &&
         (dVar11 = (double)ref_node->global[(int)uVar8], (long)dVar11 < 0)) {
        dVar11 = -NAN;
      }
      (&local_1e8)[lVar9] = dVar11;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 6);
    if ((local_1e0 < local_1d8 && local_1e0 < local_1c8) ||
       (local_1c0 < local_1c8 && local_1c0 < local_1d8)) {
      local_268 = uVar6;
      local_264 = uVar2;
      local_260 = uVar5;
      local_25c = uVar4;
      uVar8 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_268);
      if (uVar8 == 0) {
        if (check_volume != 0) {
          uVar8 = ref_node_tet_vol(ref_node,(REF_INT *)&local_268,&local_2f0);
          if (uVar8 != 0) {
            pcVar13 = "tet vol";
            uVar10 = 0x232;
            goto LAB_00188108;
          }
          if (local_2f0 <= 0.0) {
            printf("tet vol %e\n");
            printf("minnode %ld\n",local_2e8);
            printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
                   (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
            printf("prism %d %d %d %d %d %d\n",uVar7 & 0xffffffff,uVar2,(ulong)uVar3,uVar14,uVar4,
                   uVar5);
            printf("tet %d %d %d %d\n",(ulong)local_268,(ulong)local_264,(ulong)local_260,
                   (ulong)local_25c);
          }
        }
        local_268 = uVar6;
        local_260 = uVar3;
        local_264 = uVar2;
        local_25c = uVar5;
        uVar8 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_268);
        if (uVar8 == 0) {
          if (check_volume == 0) {
            return 0;
          }
          uVar8 = ref_node_tet_vol(ref_node,(REF_INT *)&local_268,&local_2f0);
          if (uVar8 == 0) goto LAB_001886b6;
          uVar10 = 0x239;
          goto LAB_001886a4;
        }
        pcVar13 = "a tet";
        uVar10 = 0x238;
      }
      else {
        pcVar13 = "a tet";
        uVar10 = 0x231;
      }
    }
    else {
      local_268 = uVar3;
      local_264 = uVar6;
      local_260 = uVar4;
      local_25c = uVar5;
      uVar8 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_268);
      if (uVar8 == 0) {
        if (check_volume != 0) {
          uVar8 = ref_node_tet_vol(ref_node,(REF_INT *)&local_268,&local_2f0);
          if (uVar8 != 0) {
            pcVar13 = "tet vol";
            uVar10 = 0x240;
            goto LAB_00188108;
          }
          if (local_2f0 <= 0.0) {
            printf("tet vol %e\n");
            printf("minnode %ld\n",local_2e8);
            printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
                   (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
            printf("prism %d %d %d %d %d %d\n",uVar7 & 0xffffffff,uVar2,(ulong)uVar3,uVar14,uVar4,
                   uVar5);
            printf("tet %d %d %d %d\n",(ulong)local_268,(ulong)local_264,(ulong)local_260,
                   (ulong)local_25c);
          }
        }
        local_268 = uVar6;
        local_260 = uVar3;
        local_264 = uVar2;
        local_25c = uVar4;
        uVar8 = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_268);
        if (uVar8 == 0) {
          if (check_volume == 0) {
            return 0;
          }
          uVar8 = ref_node_tet_vol(ref_node,(REF_INT *)&local_268,&local_2f0);
          if (uVar8 == 0) {
LAB_001886b6:
            if (0.0 < local_2f0) {
              return 0;
            }
            printf("tet vol %e\n");
            printf("minnode %ld\n",local_2e8);
            printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
                   (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
            printf("prism %d %d %d %d %d %d\n",uVar7 & 0xffffffff,uVar2,(ulong)uVar3,uVar14,uVar4,
                   uVar5);
            printf("tet %d %d %d %d\n",(ulong)local_268,(ulong)local_264,(ulong)local_260,
                   (ulong)local_25c);
            return 0;
          }
          uVar10 = 0x247;
LAB_001886a4:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 uVar10,"ref_shard_add_pri_as_tet",(ulong)uVar8,"tet vol");
          return uVar8;
        }
        pcVar13 = "a tet";
        uVar10 = 0x246;
      }
      else {
        pcVar13 = "a tet";
        uVar10 = 0x23f;
      }
    }
  }
  else {
    pcVar13 = "add tet";
    uVar10 = 0x225;
  }
LAB_00188108:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar10,
         "ref_shard_add_pri_as_tet",(ulong)uVar8,pcVar13);
  return uVar8;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_pri_as_tet(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes,
                                                   REF_BOOL check_volume) {
  REF_INT node;
  REF_GLOB minnode, global[REF_CELL_MAX_SIZE_PER];
  REF_GLOB pri_global[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];

  for (node = 0; node < 6; node++)
    global[node] = ref_node_global(ref_node, nodes[node]);

  minnode = MIN(MIN(global[0], global[1]), MIN(global[2], global[3]));
  minnode = MIN(MIN(global[4], global[5]), minnode);

  pri_nodes[0] = nodes[0];
  pri_nodes[1] = nodes[1];
  pri_nodes[2] = nodes[2];
  pri_nodes[3] = nodes[3];
  pri_nodes[4] = nodes[4];
  pri_nodes[5] = nodes[5];

  if (global[1] == minnode) {
    pri_nodes[0] = nodes[1];
    pri_nodes[1] = nodes[2];
    pri_nodes[2] = nodes[0];
    pri_nodes[3] = nodes[4];
    pri_nodes[4] = nodes[5];
    pri_nodes[5] = nodes[3];
  }

  if (global[2] == minnode) {
    pri_nodes[0] = nodes[2];
    pri_nodes[1] = nodes[0];
    pri_nodes[2] = nodes[1];
    pri_nodes[3] = nodes[5];
    pri_nodes[4] = nodes[3];
    pri_nodes[5] = nodes[4];
  }

  if (global[3] == minnode) {
    pri_nodes[0] = nodes[3];
    pri_nodes[1] = nodes[5];
    pri_nodes[2] = nodes[4];
    pri_nodes[3] = nodes[0];
    pri_nodes[4] = nodes[2];
    pri_nodes[5] = nodes[1];
  }

  if (global[4] == minnode) {
    pri_nodes[0] = nodes[4];
    pri_nodes[1] = nodes[3];
    pri_nodes[2] = nodes[5];
    pri_nodes[3] = nodes[1];
    pri_nodes[4] = nodes[0];
    pri_nodes[5] = nodes[2];
  }

  if (global[5] == minnode) {
    pri_nodes[0] = nodes[5];
    pri_nodes[1] = nodes[4];
    pri_nodes[2] = nodes[3];
    pri_nodes[3] = nodes[2];
    pri_nodes[4] = nodes[1];
    pri_nodes[5] = nodes[0];
  }

  /* node 0 is now the smallest global index of prism */

  tet_nodes[0] = pri_nodes[0];
  tet_nodes[1] = pri_nodes[4];
  tet_nodes[2] = pri_nodes[5];
  tet_nodes[3] = pri_nodes[3];
  RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "add tet");
  if (check_volume) check_tet_volume();

  for (node = 0; node < 6; node++)
    pri_global[node] = ref_node_global(ref_node, pri_nodes[node]);

  if ((pri_global[1] < pri_global[2] && pri_global[1] < pri_global[4]) ||
      (pri_global[5] < pri_global[2] && pri_global[5] < pri_global[4])) {
    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[5];
    tet_nodes[3] = pri_nodes[4];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();

    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[2];
    tet_nodes[3] = pri_nodes[5];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();
  } else {
    tet_nodes[0] = pri_nodes[2];
    tet_nodes[1] = pri_nodes[0];
    tet_nodes[2] = pri_nodes[4];
    tet_nodes[3] = pri_nodes[5];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();

    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[2];
    tet_nodes[3] = pri_nodes[4];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();
  }

  return REF_SUCCESS;
}